

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O3

bool __thiscall node::Warnings::Unset(Warnings *this,warning_type id)

{
  size_t sVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_std::_Rb_tree_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  pVar3;
  key_type local_38;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_owns = false;
  local_30._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_30);
  pVar3 = std::
          _Rb_tree<std::variant<kernel::Warning,_node::Warning>,_std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>,_std::_Select1st<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
          ::equal_range(&(this->m_warnings)._M_t,&local_38);
  sVar1 = (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<std::variant<kernel::Warning,_node::Warning>,_std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>,_std::_Select1st<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::_M_erase_aux(&(this->m_warnings)._M_t,(_Base_ptr)pVar3.first._M_node,
                 (_Base_ptr)pVar3.second._M_node);
  sVar2 = (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (sVar1 != sVar2) {
    CClientUIInterface::NotifyAlertChanged((CClientUIInterface *)&uiInterface);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return sVar1 != sVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Warnings::Unset(warning_type id)
{
    auto success{WITH_LOCK(m_mutex, return m_warnings.erase(id))};
    if (success) uiInterface.NotifyAlertChanged();
    return success;
}